

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

void __thiscall
FIX::Message::Message
          (Message *this,message_order *hdrOrder,message_order *trlOrder,message_order *order,
          string *string,DataDictionary *dataDictionary,bool validate)

{
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001eb558;
  FieldMap::FieldMap(&(this->m_header).super_FieldMap,hdrOrder);
  (this->m_header).super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001eb590;
  FieldMap::FieldMap(&(this->m_trailer).super_FieldMap,trlOrder);
  (this->m_trailer).super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001eb5c8;
  this->m_validStructure = true;
  setString(this,string,validate,dataDictionary,dataDictionary);
  return;
}

Assistant:

Message::Message( const message_order &hdrOrder,
                  const message_order &trlOrder,
                  const message_order& order,
                  const std::string& string,
                  const DataDictionary& dataDictionary,
                  bool validate )
EXCEPT ( InvalidMessage )
: FieldMap(order), m_header(hdrOrder),
  m_trailer(trlOrder), m_validStructure( true )
{
  setString( string, validate, &dataDictionary, &dataDictionary );
}